

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O1

int ON_Intersect(ON_Plane *plane,ON_Circle *circle,ON_3dPoint *point0,ON_3dPoint *point1)

{
  bool bVar1;
  int iVar2;
  ON_Plane *S;
  ON_3dPoint *pOVar3;
  double dVar4;
  double b;
  double a;
  ON_Line xline;
  double local_60;
  double local_58;
  ON_Line local_50;
  
  ON_Line::ON_Line(&local_50);
  S = ON_Circle::Plane(circle);
  bVar1 = ON_Intersect(plane,S,&local_50);
  if (bVar1) {
    iVar2 = ON_Intersect(&local_50,circle,&local_58,point0,&local_60,point1);
  }
  else {
    pOVar3 = ON_Circle::Center(circle);
    dVar4 = ON_PlaneEquation::ValueAt(&plane->plane_equation,*pOVar3);
    iVar2 = (uint)(dVar4 < 2.3283064365386963e-10) * 3;
  }
  ON_Line::~ON_Line(&local_50);
  return iVar2;
}

Assistant:

int ON_Intersect(
  const ON_Plane& plane,
  const ON_Circle& circle,
  ON_3dPoint& point0,
  ON_3dPoint& point1
                  )
{
  int rval = -1;
  ON_Line xline;
	double a,b;
  bool rc = ON_Intersect(plane, circle.Plane(), xline);
	if(rc)
  {
    rval = ON_Intersect(xline, circle, &a, point0, &b, point1);
  }
  else
  {
		double d = plane.plane_equation.ValueAt( circle.Center() );
		if(d<ON_ZERO_TOLERANCE)
			rval =3;
    else
      rval = 0;
  }
  return rval;
}